

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O1

int __thiscall lattice::graph::init(graph *this,EVP_PKEY_CTX *ctx)

{
  long *plVar1;
  pointer pMVar2;
  pointer pMVar3;
  int iVar4;
  pointer extraout_RAX;
  invalid_argument *this_00;
  bool bVar6;
  bool bVar7;
  supercell *in_RCX;
  size_t *in_RDX;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  long *in_R8;
  pointer pMVar11;
  long lVar12;
  size_t sVar13;
  offset_t cell_offset;
  coordinate_t pos;
  size_t local_c0;
  void *local_98 [2];
  long *local_88 [2];
  pair<unsigned_long,_Eigen::Matrix<long,__1,_1,_0,__1,_1>_> local_78;
  long *local_58;
  DenseStorage<double,__1,__1,__1,_0> local_48;
  pointer pbVar5;
  
  sVar13 = *in_RDX;
  if ((sVar13 != in_RCX->dim_) || (sVar13 != in_R8[1] - *in_R8 >> 2)) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"dimension mismatch");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  this->dim_ = sVar13;
  std::vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>::_M_erase_at_end
            (&this->sites_,
             (this->sites_).
             super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>.
             _M_impl.super__Vector_impl_data._M_start);
  pMVar2 = (this->coordinates_).
           super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar3 = (this->coordinates_).
           super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pMVar11 = pMVar2;
  if (pMVar3 != pMVar2) {
    do {
      free((pMVar11->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data);
      pMVar11 = pMVar11 + 1;
    } while (pMVar11 != pMVar3);
    (this->coordinates_).
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar2;
  }
  pbVar5 = (this->bonds_).
           super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->bonds_).
      super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>._M_impl.
      super__Vector_impl_data._M_finish != pbVar5) {
    (this->bonds_).
    super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>._M_impl.
    super__Vector_impl_data._M_finish = pbVar5;
  }
  if (in_RCX->num_cells_ != 0) {
    uVar8 = 0;
    do {
      supercell::offset((supercell *)local_98,(size_t)in_RCX);
      if (in_RDX[2] != in_RDX[1]) {
        lVar12 = 0;
        uVar9 = 0;
        do {
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
                    (&local_48,(DenseStorage<double,__1,__1,__1,_0> *)ctx);
          local_58 = (long *)(in_RDX[1] + lVar12);
          local_78.second.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows = (Index)local_98;
          local_78.first = (unsigned_long)&local_48;
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
          PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,double>,Eigen::Matrix<long,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,0>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_88,
                     (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
                      *)&local_78);
          free(local_48.m_data);
          add_site(this,(coordinate_t *)local_88,*(int *)(in_RDX[1] + 0x10 + lVar12));
          free(local_88[0]);
          uVar9 = uVar9 + 1;
          lVar12 = lVar12 + 0x18;
        } while (uVar9 < (ulong)(((long)(in_RDX[2] - in_RDX[1]) >> 3) * -0x5555555555555555));
      }
      free(local_98[0]);
      uVar8 = uVar8 + 1;
      pbVar5 = extraout_RAX;
    } while (uVar8 < in_RCX->num_cells_);
  }
  iVar4 = (int)pbVar5;
  if (in_RCX->num_cells_ != 0) {
    local_c0 = 0;
    do {
      sVar13 = in_RDX[4];
      if (in_RDX[5] != sVar13) {
        uVar8 = 0;
        do {
          plVar1 = (long *)(sVar13 + uVar8 * 0x28);
          sVar13 = ((long)(in_RDX[2] - in_RDX[1]) >> 3) * local_c0 * -0x5555555555555555 + *plVar1;
          supercell::add_offset(&local_78,in_RCX,local_c0,(offset_t *)(plVar1 + 2));
          plVar1 = local_78.second.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data;
          local_78.second.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.
          m_data = (long *)0x0;
          local_78.second.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows = 0;
          if (this->dim_ == 0) {
LAB_0010be47:
            sVar10 = local_78.first * -0x5555555555555555 * ((long)(in_RDX[2] - in_RDX[1]) >> 3) +
                     *(long *)(in_RDX[4] + 8 + uVar8 * 0x28);
            if (sVar13 != sVar10) {
              add_bond(this,sVar13,sVar10,*(int *)(in_RDX[4] + uVar8 * 0x28 + 0x20));
            }
          }
          else {
            bVar6 = true;
            bVar7 = true;
            sVar10 = 0;
            do {
              if ((*(int *)(*in_R8 + sVar10 * 4) == 0) &&
                 (bVar7 = bVar6, (double)plVar1[sVar10] != 0.0)) {
                bVar6 = false;
                bVar7 = false;
              }
              sVar10 = sVar10 + 1;
            } while (this->dim_ != sVar10);
            if (bVar7) goto LAB_0010be47;
          }
          free(plVar1);
          uVar8 = uVar8 + 1;
          sVar13 = in_RDX[4];
        } while (uVar8 < (ulong)(((long)(in_RDX[5] - sVar13) >> 3) * -0x3333333333333333));
      }
      iVar4 = (int)sVar13;
      local_c0 = local_c0 + 1;
    } while (local_c0 < in_RCX->num_cells_);
  }
  return iVar4;
}

Assistant:

graph(const basis& bs, const unitcell& cell, const extent_t& extent,
        boundary_t boundary = boundary_t::periodic) {
    init(bs, cell, supercell(extent), std::vector<boundary_t>(cell.dimension(), boundary));
  }